

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetEpsLin(void *arkode_mem,realtype eplifac)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = eplifac;
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetEpsLin",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->eplifac =
         (realtype)
         (~-(ulong)(local_18 <= 0.0) & (ulong)local_18 |
         -(ulong)(local_18 <= 0.0) & 0x3fa999999999999a);
  }
  return iVar1;
}

Assistant:

int arkLSSetEpsLin(void *arkode_mem, realtype eplifac)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetEpsLin",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return(ARKLS_SUCCESS);
}